

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_27f4c0::PeerManagerImpl::BlockRequested
          (PeerManagerImpl *this,NodeId nodeid,CBlockIndex *block,iterator **pit)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  uint256 *puVar3;
  CTxMemPool *pCVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  time_point tVar11;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  _Var12;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  extraout_RDX;
  bool bVar14;
  pointer *__ptr;
  _Base_ptr p_Var15;
  _Self __tmp;
  long in_FS_OFFSET;
  optional<long> from_peer;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  pVar16;
  undefined1 local_58 [16];
  _Base_ptr local_48;
  _Base_ptr p_Stack_40;
  long local_38;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  _Var13;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar3 = block->phashBlock;
  if (puVar3 == (uint256 *)0x0) {
    __assert_fail("phashBlock != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                  ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
  }
  local_58._0_8_ = *(undefined8 *)(puVar3->super_base_blob<256U>).m_data._M_elems;
  local_58._8_8_ = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
  local_48 = *(_Base_ptr *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
  p_Stack_40 = *(_Base_ptr *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
  p_Var9 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var9 != (_Base_ptr)0x0) {
    p_Var1 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
    p_Var15 = &p_Var1->_M_header;
    do {
      if (nodeid <= *(long *)(p_Var9 + 1)) {
        p_Var15 = p_Var9;
      }
      p_Var9 = (&p_Var9->_M_left)[*(long *)(p_Var9 + 1) < nodeid];
    } while (p_Var9 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var15 != p_Var1) && (*(long *)(p_Var15 + 1) <= nodeid)) {
      pVar16 = std::
               multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
               ::equal_range(&this->mapBlocksInFlight,(key_type *)local_58);
      _Var13 = pVar16.second._M_node;
      _Var12 = pVar16.first._M_node;
      do {
        if (_Var12._M_node == _Var13._M_node) {
          from_peer.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._8_8_ = 1;
          from_peer.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = nodeid;
          RemoveBlockRequest(this,(uint256 *)local_58,from_peer);
          if (pit == (iterator **)0x0) {
            p_Var9 = (_Base_ptr)0x0;
          }
          else {
            p_Var9 = (_Base_ptr)operator_new(0xa8);
            pCVar4 = this->m_mempool;
            *(undefined8 *)p_Var9 = 0;
            p_Var9->_M_parent = (_Base_ptr)0x0;
            p_Var9->_M_left = (_Base_ptr)0x0;
            p_Var9->_M_right = (_Base_ptr)0x0;
            *(undefined8 *)(p_Var9 + 1) = 0;
            p_Var9[1]._M_parent = (_Base_ptr)0x0;
            p_Var9[1]._M_left = (_Base_ptr)pCVar4;
            p_Var9[4]._M_right = (_Base_ptr)0x0;
            *(undefined8 *)(p_Var9 + 5) = 0;
            p_Var9[4]._M_parent = (_Base_ptr)0x0;
            p_Var9[4]._M_left = (_Base_ptr)0x0;
            p_Var9[3]._M_right = (_Base_ptr)0x0;
            *(undefined8 *)(p_Var9 + 4) = 0;
            p_Var9[3]._M_parent = (_Base_ptr)0x0;
            p_Var9[3]._M_left = (_Base_ptr)0x0;
            p_Var9[2]._M_right = (_Base_ptr)0x0;
            *(undefined8 *)(p_Var9 + 3) = 0;
            p_Var9[2]._M_parent = (_Base_ptr)0x0;
            p_Var9[2]._M_left = (_Base_ptr)0x0;
            p_Var9[1]._M_right = (_Base_ptr)0x0;
            *(undefined8 *)(p_Var9 + 2) = 0;
          }
          p_Var10 = (_Base_ptr)operator_new(0x20);
          p_Var10->_M_left = (_Base_ptr)block;
          p_Var10->_M_right = p_Var9;
          std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var10);
          lVar5 = *(long *)(p_Var15 + 4);
          *(long *)(p_Var15 + 4) = lVar5 + 1;
          if (lVar5 == 0) {
            tVar11 = NodeClock::now();
            p_Var15[4]._M_parent = (_Base_ptr)((long)tVar11.__d.__r / 1000);
            this->m_peers_downloading_from = this->m_peers_downloading_from + 1;
          }
          _Var12._M_node = (_Base_ptr)operator_new(0x50);
          *(undefined8 *)(_Var12._M_node + 1) = local_58._0_8_;
          _Var12._M_node[1]._M_parent = (_Base_ptr)local_58._8_8_;
          _Var12._M_node[1]._M_left = local_48;
          _Var12._M_node[1]._M_right = p_Stack_40;
          *(NodeId *)(_Var12._M_node + 2) = nodeid;
          _Var12._M_node[2]._M_parent = p_Var10;
          p_Var1 = &(this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          bVar6 = true;
          p_Var15 = &p_Var1->_M_header;
          if (p_Var9 != (_Base_ptr)0x0) {
            do {
              p_Var15 = p_Var9;
              uVar7 = memcmp(_Var12._M_node + 1,p_Var15 + 1,0x20);
              p_Var9 = (&p_Var15->_M_left)[~uVar7 >> 0x1f];
            } while ((&p_Var15->_M_left)[~uVar7 >> 0x1f] != (_Base_ptr)0x0);
            if (p_Var1 == (_Rb_tree_header *)p_Var15) {
              bVar6 = true;
            }
            else {
              iVar8 = memcmp(_Var12._M_node + 1,p_Var15 + 1,0x20);
              bVar6 = SUB41((uint)iVar8 >> 0x1f,0);
            }
          }
          bVar14 = true;
          std::_Rb_tree_insert_and_rebalance
                    (bVar6,(_Rb_tree_node_base *)_Var12._M_node,(_Rb_tree_node_base *)p_Var15,
                     (_Rb_tree_node_base *)p_Var1);
          pVar16.second._M_node = extraout_RDX._M_node;
          pVar16.first._M_node = _Var12._M_node;
          psVar2 = &(this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_node_count;
          *psVar2 = *psVar2 + 1;
          bVar6 = true;
          if (pit != (iterator **)0x0) {
LAB_001d78de:
            bVar14 = bVar6;
            *pit = (iterator *)&pVar16.first._M_node._M_node[2]._M_parent;
          }
LAB_001d78e2:
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            return bVar14;
          }
          __stack_chk_fail();
        }
        if (*(long *)(pVar16.first._M_node._M_node + 2) == nodeid) {
          if (pit != (iterator **)0x0) {
            bVar6 = false;
            goto LAB_001d78de;
          }
          bVar14 = false;
          goto LAB_001d78e2;
        }
        pVar16 = (pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
                  )std::_Rb_tree_increment((_Rb_tree_node_base *)pVar16.first._M_node._M_node);
        _Var12 = pVar16.first._M_node;
      } while( true );
    }
  }
  __assert_fail("state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                ,0x546,
                "bool (anonymous namespace)::PeerManagerImpl::BlockRequested(NodeId, const CBlockIndex &, std::list<QueuedBlock>::iterator **)"
               );
}

Assistant:

bool PeerManagerImpl::BlockRequested(NodeId nodeid, const CBlockIndex& block, std::list<QueuedBlock>::iterator** pit)
{
    const uint256& hash{block.GetBlockHash()};

    CNodeState *state = State(nodeid);
    assert(state != nullptr);

    Assume(mapBlocksInFlight.count(hash) <= MAX_CMPCTBLOCKS_INFLIGHT_PER_BLOCK);

    // Short-circuit most stuff in case it is from the same node
    for (auto range = mapBlocksInFlight.equal_range(hash); range.first != range.second; range.first++) {
        if (range.first->second.first == nodeid) {
            if (pit) {
                *pit = &range.first->second.second;
            }
            return false;
        }
    }

    // Make sure it's not being fetched already from same peer.
    RemoveBlockRequest(hash, nodeid);

    std::list<QueuedBlock>::iterator it = state->vBlocksInFlight.insert(state->vBlocksInFlight.end(),
            {&block, std::unique_ptr<PartiallyDownloadedBlock>(pit ? new PartiallyDownloadedBlock(&m_mempool) : nullptr)});
    if (state->vBlocksInFlight.size() == 1) {
        // We're starting a block download (batch) from this peer.
        state->m_downloading_since = GetTime<std::chrono::microseconds>();
        m_peers_downloading_from++;
    }
    auto itInFlight = mapBlocksInFlight.insert(std::make_pair(hash, std::make_pair(nodeid, it)));
    if (pit) {
        *pit = &itInFlight->second.second;
    }
    return true;
}